

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O1

void __thiscall XmlRpc::XmlRpcValue::assertTypeOrInvalid(XmlRpcValue *this,Type t)

{
  string *psVar1;
  tm *ptVar2;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (this->_type == TypeInvalid) {
    this->_type = t;
    switch(t) {
    case TypeString:
      ptVar2 = (tm *)operator_new(0x20);
      *(int **)ptVar2 = &ptVar2->tm_mon;
      ptVar2->tm_hour = 0;
      ptVar2->tm_mday = 0;
      *(undefined1 *)&ptVar2->tm_mon = 0;
      break;
    case TypeDateTime:
      ptVar2 = (tm *)operator_new(0x38);
      ptVar2->tm_sec = 0;
      ptVar2->tm_min = 0;
      ptVar2->tm_hour = 0;
      ptVar2->tm_mday = 0;
      ptVar2->tm_mon = 0;
      ptVar2->tm_year = 0;
      ptVar2->tm_wday = 0;
      ptVar2->tm_yday = 0;
      *(undefined8 *)&ptVar2->tm_isdst = 0;
      ptVar2->tm_gmtoff = 0;
      ptVar2->tm_zone = (char *)0x0;
      break;
    case TypeBase64:
    case TypeArray:
      ptVar2 = (tm *)operator_new(0x18);
      ptVar2->tm_sec = 0;
      ptVar2->tm_min = 0;
      ptVar2->tm_hour = 0;
      ptVar2->tm_mday = 0;
      ptVar2->tm_mon = 0;
      ptVar2->tm_year = 0;
      break;
    case TypeStruct:
      ptVar2 = (tm *)operator_new(0x30);
      ptVar2->tm_mon = 0;
      ptVar2->tm_year = 0;
      ptVar2->tm_wday = 0;
      ptVar2->tm_yday = 0;
      *(undefined8 *)&ptVar2->tm_isdst = 0;
      ptVar2->tm_gmtoff = 0;
      ptVar2->tm_sec = 0;
      ptVar2->tm_min = 0;
      ptVar2->tm_hour = 0;
      ptVar2->tm_mday = 0;
      *(int **)&ptVar2->tm_wday = &ptVar2->tm_hour;
      *(int **)&ptVar2->tm_isdst = &ptVar2->tm_hour;
      ptVar2->tm_gmtoff = 0;
      break;
    default:
      (this->_value).asDouble = 0.0;
      return;
    }
    (this->_value).asTime = ptVar2;
  }
  else if (this->_type != t) {
    psVar1 = (string *)__cxa_allocate_exception(0x28);
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"type error","");
    *(string **)psVar1 = psVar1 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar1,local_40,local_40 + local_38);
    *(undefined4 *)(psVar1 + 0x20) = 0xffffffff;
    __cxa_throw(psVar1,&XmlRpcException::typeinfo,XmlRpcException::~XmlRpcException);
  }
  return;
}

Assistant:

void XmlRpcValue::assertTypeOrInvalid(Type t)
  {
    if (_type == TypeInvalid)
    {
      _type = t;
      switch (_type) {    // Ensure there is a valid value for the type
        case TypeString:   _value.asString = new std::string(); break;
        case TypeDateTime: _value.asTime = new struct tm();     break;
        case TypeBase64:   _value.asBinary = new BinaryData();  break;
        case TypeArray:    _value.asArray = new ValueArray();   break;
        case TypeStruct:   _value.asStruct = new ValueStruct(); break;
        default:           _value.asBinary = 0; break;
      }
    }
    else if (_type != t)
      throw XmlRpcException("type error");
  }